

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O1

int __thiscall
Centaurus::ChaserEM64T<unsigned_char>::init(ChaserEM64T<unsigned_char> *this,EVP_PKEY_CTX *ctx)

{
  CodeHolder *this_00;
  int iVar1;
  long lVar2;
  long lVar3;
  int extraout_EAX;
  mapped_type *pmVar4;
  ulong uVar5;
  mapped_type *pp_Var6;
  undefined8 extraout_RAX;
  socklen_t __len;
  ErrorHandler *in_RCX;
  key_type *__k;
  Logger *in_RDX;
  sockaddr *__addr;
  long *plVar7;
  char *func_base;
  X86Mem skipfilter_mem;
  CompositeATN<unsigned_char> catn;
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  machinelabels;
  MyConstPool pool;
  X86Assembler as;
  anon_union_16_7_ed616b9d_for_Operand__0 local_2d8;
  CodeHolder *local_2c8;
  Operand_ *local_2c0;
  Operand_ *local_2b8;
  Operand_ *local_2b0;
  undefined1 local_2a8 [32];
  undefined1 local_288 [8];
  _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  _Stack_280;
  undefined1 local_240 [24];
  anon_union_16_7_ed616b9d_for_Operand__0 local_228;
  float local_218;
  anon_union_16_7_ed616b9d_for_Operand__0 local_210;
  undefined1 local_200 [8];
  Zone local_1f8;
  ConstPool local_1d8;
  undefined1 local_f8 [16];
  Assembler local_e8;
  
  this_00 = &this->m_code;
  asmjit::CodeHolder::init
            (this_00,(EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (in_RDX != (Logger *)0x0) {
    asmjit::CodeHolder::setLogger(this_00,in_RDX);
  }
  if (in_RCX != (ErrorHandler *)0x0) {
    asmjit::CodeHolder::setErrorHandler(this_00,in_RCX);
  }
  local_240._8_8_ = &local_210._any.reserved8_4;
  local_240._16_8_ = (anon_union_8_2_78723da6_for_MemData_2)0x1;
  local_228._packed[0] = (UInt64)0x0;
  local_228._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
  local_218 = 1.0;
  local_210._packed[0] = (UInt64)0x0;
  local_210._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
  local_2c8 = this_00;
  asmjit::X86Assembler::X86Assembler((X86Assembler *)&local_e8,this_00);
  plVar7 = *(long **)(ctx + 0x20);
  if (plVar7 != (long *)0x0) {
    do {
      asmjit::Assembler::newLabel((Assembler *)local_288);
      local_200 = (undefined1  [8])&PTR__Identifier_001a6cd8;
      local_1f8._ptr = (uint8_t *)&local_1f8._block;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)(local_200 + 8),plVar7[2],plVar7[2] + plVar7[3] * 4);
      local_1d8._zone = (Zone *)local_288;
      local_1d8._tree[0]._root = (Node *)_Stack_280._0_8_;
      std::
      _Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,asmjit::Label>,std::allocator<std::pair<Centaurus::Identifier_const,asmjit::Label>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<Centaurus::Identifier,asmjit::Label>>
                ((_Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,asmjit::Label>,std::allocator<std::pair<Centaurus::Identifier_const,asmjit::Label>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_240,local_200);
      local_200 = (undefined1  [8])&PTR__Identifier_001a6cd8;
      if ((Block **)local_1f8._ptr != &local_1f8._block) {
        operator_delete(local_1f8._ptr);
      }
      plVar7 = (long *)*plVar7;
    } while (plVar7 != (long *)0x0);
  }
  MyConstPool::MyConstPool((MyConstPool *)local_200,(X86Assembler *)&local_e8);
  _local_288 = pack_charclass((CharClass<unsigned_char> *)m_skipfilter);
  asmjit::ConstPool::add(&local_1d8,local_288,0x10,(size_t *)local_2a8);
  local_2a8._16_8_ = 10;
  __k = (key_type *)(ulong)(uint)local_f8._4_4_;
  local_2a8._28_4_ = local_f8._4_4_;
  local_2a8._24_4_ = local_2a8._0_4_;
  CompositeATN<unsigned_char>::CompositeATN
            ((CompositeATN<unsigned_char> *)local_288,(Grammar<unsigned_char> *)ctx);
  plVar7 = *(long **)(ctx + 0x20);
  if (plVar7 != (long *)0x0) {
    local_2b0 = (Operand_ *)(asmjit::x86OpData + 0x500);
    local_2b8 = (Operand_ *)(asmjit::x86OpData + 0x4e0);
    local_2c0 = (Operand_ *)(asmjit::x86OpData + 0x710);
    do {
      __len = (socklen_t)__k;
      asmjit::Assembler::newLabel((Assembler *)local_2a8);
      __k = (key_type *)(plVar7 + 1);
      pmVar4 = std::__detail::
               _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_240,__k);
      asmjit::Assembler::bind(&local_e8,(int)pmVar4,__addr,__len);
      emit_parser_prolog((X86Assembler *)&local_e8);
      local_2d8._packed[0] = (UInt64)0x32;
      local_2d8._any.reserved12_4 = 4;
      local_2d8._any.reserved8_4 = 0x20;
      asmjit::CodeEmitter::emit
                (&local_e8.super_CodeEmitter,0x189,local_2b0,(Operand_ *)&local_2d8._any);
      local_2d8._packed[0] = (UInt64)0x32;
      local_2d8._any.reserved12_4 = 4;
      local_2d8._any.reserved8_4 = 0x18;
      asmjit::CodeEmitter::emit
                (&local_e8.super_CodeEmitter,0x189,local_2b8,(Operand_ *)&local_2d8._any);
      asmjit::CodeEmitter::emit
                (&local_e8.super_CodeEmitter,400,local_2c0,(Operand_ *)(local_2a8 + 0x10));
      emit_machine(this,(X86Assembler *)&local_e8,(Grammar<unsigned_char> *)ctx,__k,
                   (CompositeATN<unsigned_char> *)local_288,(Label *)local_2a8,
                   (MyConstPool *)local_200);
      emit_parser_epilog((X86Assembler *)&local_e8,(Label *)local_2a8);
      plVar7 = (long *)*plVar7;
    } while (plVar7 != (long *)0x0);
  }
  (**(code **)(*(undefined **)local_200 + 0x68))(local_200,local_f8,&local_1d8);
  asmjit::CodeEmitter::finalize(&local_e8.super_CodeEmitter);
  (*(this->m_runtime).super_HostRuntime.super_Runtime._vptr_Runtime[2])
            (&this->m_runtime,local_2a8,local_2c8);
  plVar7 = *(long **)(ctx + 0x20);
  if (plVar7 != (long *)0x0) {
    do {
      lVar3 = CONCAT44(local_2a8._4_4_,local_2a8._0_4_);
      pmVar4 = std::__detail::
               _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_240,(key_type *)(plVar7 + 1));
      uVar5 = (ulong)((pmVar4->super_Operand).super_Operand_.field_0._any.id - 0x100);
      if ((this->m_code)._labels.super_ZoneVectorBase._length <= uVar5) {
        init();
        asmjit::ConstPool::~ConstPool(&local_1d8);
        asmjit::Zone::~Zone((Zone *)(local_200 + 8));
        asmjit::X86Assembler::~X86Assembler((X86Assembler *)&local_e8);
        std::
        _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_240);
        _Unwind_Resume(extraout_RAX);
      }
      lVar2 = *(long *)(*(long *)((long)(this->m_code)._labels.super_ZoneVectorBase._data +
                                 uVar5 * 8) + 0x20);
      pp_Var6 = std::__detail::
                _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>,_std::allocator<std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>,_std::allocator<std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->m_funcmap,(key_type *)(plVar7 + 1));
      *pp_Var6 = (mapped_type)(lVar3 + lVar2);
      plVar7 = (long *)*plVar7;
    } while (plVar7 != (long *)0x0);
  }
  plVar7 = *(long **)(ctx + 0x20);
  if (plVar7 != (long *)0x0) {
    do {
      iVar1 = (int)plVar7[10];
      if ((ulong)((long)(this->m_funcarray).
                        super__Vector_base<void_*(*)(void_*,_const_void_*),_std::allocator<void_*(*)(void_*,_const_void_*)>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_funcarray).
                        super__Vector_base<void_*(*)(void_*,_const_void_*),_std::allocator<void_*(*)(void_*,_const_void_*)>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)(long)iVar1) {
        std::
        vector<void_*(*)(void_*,_const_void_*),_std::allocator<void_*(*)(void_*,_const_void_*)>_>::
        resize(&this->m_funcarray,(long)(iVar1 + 1));
      }
      pp_Var6 = std::__detail::
                _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>,_std::allocator<std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>,_std::allocator<std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->m_funcmap,(key_type *)(plVar7 + 1));
      (this->m_funcarray).
      super__Vector_base<void_*(*)(void_*,_const_void_*),_std::allocator<void_*(*)(void_*,_const_void_*)>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar1] = *pp_Var6;
      plVar7 = (long *)*plVar7;
    } while (plVar7 != (long *)0x0);
  }
  local_288 = (undefined1  [8])&PTR__CompositeATN_001a8088;
  std::
  _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_288 + 8));
  asmjit::ConstPool::~ConstPool(&local_1d8);
  asmjit::Zone::~Zone((Zone *)(local_200 + 8));
  asmjit::X86Assembler::~X86Assembler((X86Assembler *)&local_e8);
  std::
  _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_240);
  return extraout_EAX;
}

Assistant:

void ChaserEM64T<TCHAR>::init(const Grammar<TCHAR>& grammar, asmjit::Logger *logger, asmjit::ErrorHandler *errhandler)
{
	m_code.init(m_runtime.getCodeInfo());
	if (logger != NULL)
		m_code.setLogger(logger);
	if (errhandler != NULL)
		m_code.setErrorHandler(errhandler);
	
	std::unordered_map<Identifier, asmjit::Label> machinelabels;

	asmjit::X86Assembler as(&m_code);

	for (const auto& p : grammar)
	{
		machinelabels.emplace(std::pair<Identifier, asmjit::Label>(p.first, as.newLabel()));
	}
	
	MyConstPool pool(as);

    asmjit::X86Mem skipfilter_mem = pool.add(pack_charclass(m_skipfilter));

    CompositeATN<TCHAR> catn(grammar);

	for (const auto& p : grammar)
	{
		asmjit::Label rejectlabel = as.newLabel();

		as.bind(machinelabels[p.first]);

		emit_parser_prolog(as);

        as.mov(CONTEXT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));
        as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG2_STACK_OFFSET));
        as.movdqa(PATTERN_REG, skipfilter_mem);

		emit_machine(as, grammar, p.first, catn, rejectlabel, pool);

		emit_parser_epilog(as, rejectlabel);
	}

	pool.embed();

	as.finalize();

    char *func_base;
	m_runtime.add(&func_base, &m_code);

    for (const auto& p : grammar)
    {
        m_funcmap[p.first] = reinterpret_cast<ChaserFunc>(func_base + m_code.getLabelOffset(machinelabels[p.first]));
    }

    for (const auto& p : grammar)
    {
        int id = p.second.get_unique_id();
        if (m_funcarray.size() <= id)
            m_funcarray.resize(id + 1);
        m_funcarray[id] = m_funcmap[p.first];
    }
}